

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  byte bVar1;
  runtime_error *this;
  int *in_RSI;
  string *in_RDI;
  stringstream ss;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  string local_1c8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  stringstream local_198 [16];
  ostream local_188 [376];
  int *local_10;
  string *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,local_8);
  std::istream::operator>>((istream *)local_198,local_10);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::~stringstream(local_198);
    return;
  }
  uVar2 = 1;
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::operator+(in_stack_fffffffffffffe18,
                 (char *)CONCAT17(uVar2,CONCAT16(bVar1,in_stack_fffffffffffffe10)));
  std::runtime_error::runtime_error(this,local_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }